

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_io.cc
# Opt level: O0

Ptr __thiscall core::image::load_jpg_file(image *this,string *filename,string *exif)

{
  bool bVar1;
  char *pcVar2;
  FILE *__stream;
  FileException *this_00;
  int *piVar3;
  Exception *pEVar4;
  TypedImageBase<unsigned_char> *this_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Ptr PVar5;
  reference local_400;
  uchar *data_ptr;
  ImageData *data;
  int local_3e0;
  int channels;
  int height;
  int width;
  char *local_3b0;
  char *data_1;
  jpeg_saved_marker_ptr_conflict marker;
  string local_398 [32];
  int local_378;
  int ret;
  undefined1 local_361;
  code *local_360;
  jpeg_error_mgr jerr;
  jpeg_decompress_struct cinfo;
  FILE *fp;
  string *exif_local;
  string *filename_local;
  Ptr *image;
  
  pcVar2 = (char *)std::__cxx11::string::c_str();
  __stream = fopen(pcVar2,"rb");
  if (__stream == (FILE *)0x0) {
    this_00 = (FileException *)__cxa_allocate_exception(0x48);
    piVar3 = __errno_location();
    pcVar2 = strerror(*piVar3);
    util::FileException::FileException(this_00,filename,pcVar2);
    __cxa_throw(this_00,&util::FileException::typeinfo,util::FileException::~FileException);
  }
  local_361 = 0;
  std::shared_ptr<core::Image<unsigned_char>_>::shared_ptr
            ((shared_ptr<core::Image<unsigned_char>_> *)this);
  jerr._160_8_ = jpeg_std_error(&local_360);
  local_360 = jpg_error_handler;
  jerr.error_exit = jpg_message_handler;
  jpeg_CreateDecompress(&jerr.first_addon_message,0x50,0x290);
  jpeg_stdio_src(&jerr.first_addon_message,__stream);
  if (exif != (string *)0x0) {
    jpeg_save_markers(&jerr.first_addon_message,0xe1,0xffff);
  }
  local_378 = jpeg_read_header(&jerr.first_addon_message,0);
  if (local_378 != 1) {
    marker._6_1_ = 1;
    pEVar4 = (Exception *)__cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_398,"JPEG header not recognized",(allocator *)((long)&marker + 7));
    util::Exception::Exception(pEVar4,(string *)local_398);
    marker._6_1_ = 0;
    __cxa_throw(pEVar4,&util::Exception::typeinfo,util::Exception::~Exception);
  }
  if ((((exif != (string *)0x0) && (data_1 = (char *)cinfo._392_8_, cinfo._392_8_ != 0)) &&
      (*(char *)(cinfo._392_8_ + 8) == -0x1f)) &&
     ((6 < *(uint *)(cinfo._392_8_ + 0x10) &&
      (bVar1 = std::equal<unsigned_char*,char_const*>
                         (*(uchar **)(cinfo._392_8_ + 0x18),*(uchar **)(cinfo._392_8_ + 0x18) + 6,
                          "Exif"), bVar1)))) {
    local_3b0 = *(char **)(data_1 + 0x18);
    std::__cxx11::string::append<char_const*,void>
              ((string *)exif,local_3b0,local_3b0 + *(uint *)(data_1 + 0x10));
  }
  if ((cinfo.num_components != 1) && (cinfo.num_components != 2)) {
    height._2_1_ = 1;
    pEVar4 = (Exception *)__cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&width,"Invalid JPEG color space",(allocator *)((long)&height + 3));
    util::Exception::Exception(pEVar4,(string *)&width);
    height._2_1_ = 0;
    __cxa_throw(pEVar4,&util::Exception::typeinfo,util::Exception::~Exception);
  }
  local_3e0 = (cinfo.num_components == 2) + 1 + (uint)(cinfo.num_components == 2);
  Image<unsigned_char>::create
            ((Image<unsigned_char> *)&data,(int)cinfo.src,cinfo.src._4_4_,local_3e0);
  std::shared_ptr<core::Image<unsigned_char>_>::operator=
            ((shared_ptr<core::Image<unsigned_char>_> *)this,
             (shared_ptr<core::Image<unsigned_char>_> *)&data);
  std::shared_ptr<core::Image<unsigned_char>_>::~shared_ptr
            ((shared_ptr<core::Image<unsigned_char>_> *)&data);
  this_01 = &std::
             __shared_ptr_access<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this)->super_TypedImageBase<unsigned_char>;
  data_ptr = (uchar *)TypedImageBase<unsigned_char>::get_data(this_01);
  jpeg_start_decompress(&jerr.first_addon_message);
  local_400 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)data_ptr,0);
  while ((uint)cinfo.colormap < (uint)cinfo.enable_2pass_quant) {
    jpeg_read_scanlines(&jerr.first_addon_message,&local_400,1);
    local_400 = local_400 + (uint)(local_3e0 * cinfo.enable_external_quant);
  }
  jpeg_finish_decompress(&jerr.first_addon_message);
  jpeg_destroy_decompress(&jerr.first_addon_message);
  fclose(__stream);
  PVar5.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = extraout_RDX._M_pi;
  PVar5.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Ptr)PVar5.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ByteImage::Ptr
load_jpg_file (std::string const& filename, std::string* exif)
{
    FILE* fp = std::fopen(filename.c_str(), "rb");
    if (fp == nullptr)
        throw util::FileException(filename, std::strerror(errno));

    jpeg_decompress_struct cinfo;
    jpeg_error_mgr jerr;
    ByteImage::Ptr image;
    try
    {
        /* Setup error handler and JPEG reader. */
        cinfo.err = jpeg_std_error(&jerr);
        jerr.error_exit = &jpg_error_handler;
        jerr.emit_message = &jpg_message_handler;
        jpeg_create_decompress(&cinfo);
        jpeg_stdio_src(&cinfo, fp);

        if (exif)
        {
            /* Request APP1 marker to be saved (this is the EXIF data). */
            jpeg_save_markers(&cinfo, JPEG_APP0 + 1, 0xffff);
        }

        /* Read JPEG header. */
        int ret = jpeg_read_header(&cinfo, static_cast<boolean>(false));
        if (ret != JPEG_HEADER_OK)
            throw util::Exception("JPEG header not recognized");

        /* Examine JPEG markers. */
        if (exif)
        {
            jpeg_saved_marker_ptr marker = cinfo.marker_list;
            if (marker != nullptr && marker->marker == JPEG_APP0 + 1
                && marker->data_length > 6
                && std::equal(marker->data, marker->data + 6, "Exif\0\0"))
            {
                char const* data = reinterpret_cast<char const*>(marker->data);
                exif->append(data, data + marker->data_length);
            }
        }

        if (cinfo.out_color_space != JCS_GRAYSCALE
            && cinfo.out_color_space != JCS_RGB)
            throw util::Exception("Invalid JPEG color space");

        /* Create image. */
        int const width = cinfo.image_width;
        int const height = cinfo.image_height;
        int const channels = (cinfo.out_color_space == JCS_RGB ? 3 : 1);
        image = ByteImage::create(width, height, channels);
        ByteImage::ImageData& data = image->get_data();

        /* Start decompression. */
        jpeg_start_decompress(&cinfo);

        unsigned char* data_ptr = &data[0];
        while (cinfo.output_scanline < cinfo.output_height)
        {
            jpeg_read_scanlines(&cinfo, &data_ptr, 1);
            data_ptr += channels * cinfo.output_width;
        }

        /* Shutdown JPEG decompression. */
        jpeg_finish_decompress(&cinfo);
        jpeg_destroy_decompress(&cinfo);
        std::fclose(fp);
    }
    catch (...)
    {
        jpeg_destroy_decompress(&cinfo);
        std::fclose(fp);
        throw;
    }

    return image;
}